

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool MergeNestedElements(TidyDocImpl *doc,TidyTagId Id,TidyTriState state,Node *node,Node **pnode)

{
  Node *child_00;
  Bool BVar1;
  Node *child;
  Node **pnode_local;
  Node *node_local;
  TidyTriState state_local;
  TidyTagId Id_local;
  TidyDocImpl *doc_local;
  
  if ((((state == TidyNoState) || (node == (Node *)0x0)) || (node->tag == (Dict *)0x0)) ||
     (node->tag->id != Id)) {
    doc_local._4_4_ = no;
  }
  else {
    child_00 = node->content;
    if (((child_00 == (Node *)0x0) || (child_00->next != (Node *)0x0)) ||
       ((child_00 == (Node *)0x0 || ((child_00->tag == (Dict *)0x0 || (child_00->tag->id != Id))))))
    {
      doc_local._4_4_ = no;
    }
    else {
      if ((state == TidyAutoState) && (BVar1 = CopyAttrs(doc,node,child_00), BVar1 == no)) {
        return no;
      }
      MergeStyles(doc,node,child_00);
      StripOnlyChild(doc,node);
      doc_local._4_4_ = yes;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool MergeNestedElements( TidyDocImpl* doc,
                                 TidyTagId Id, TidyTriState state, Node *node,
                                 Node **ARG_UNUSED(pnode))
{
    Node *child;

    if ( state == TidyNoState
         || !TagIsId(node, Id) )
        return no;

    child = node->content;

    if ( child == NULL
         || child->next != NULL
         || !TagIsId(child, Id) )
        return no;

    if ( state == TidyAutoState
         && CopyAttrs(doc, node, child) == no )
        return no;

    MergeStyles( doc, node, child );
    StripOnlyChild( doc, node );
    return yes;
}